

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O1

void Intra4Preds_C(uint8_t *dst,uint8_t *top)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  undefined4 uVar7;
  ulong uVar8;
  undefined1 auVar9 [13];
  undefined1 auVar10 [13];
  undefined1 auVar11 [13];
  undefined1 auVar12 [13];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined7 uVar17;
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  uint5 uVar20;
  undefined1 auVar21 [13];
  undefined1 auVar22 [13];
  undefined1 auVar23 [15];
  uint7 uVar24;
  uint uVar25;
  uint8_t *puVar26;
  uint8_t uVar27;
  long lVar28;
  uint uVar29;
  long lVar30;
  byte bVar31;
  ushort uVar32;
  ushort uVar33;
  byte bVar38;
  short sVar35;
  ushort uVar36;
  ushort uVar37;
  short sVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  undefined1 auVar34 [16];
  undefined1 auVar44 [16];
  
  uVar25 = *(uint *)top;
  auVar9[0xc] = (char)(uVar25 >> 0x18);
  auVar9._0_12_ = ZEXT712(0);
  uVar20 = CONCAT32(auVar9._10_3_,(ushort)(byte)(uVar25 >> 0x10));
  auVar22._5_8_ = 0;
  auVar22._0_5_ = uVar20;
  uVar7 = *(undefined4 *)(top + -5);
  uVar8 = (ulong)(ushort)uVar7 & 0xffffffffffff00ff;
  auVar10._8_4_ = 0;
  auVar10._0_8_ = uVar8;
  auVar10[0xc] = (char)((uint)uVar7 >> 0x18);
  auVar11[8] = (char)((uint)uVar7 >> 0x10);
  auVar11._0_8_ = uVar8;
  auVar11[9] = 0;
  auVar11._10_3_ = auVar10._10_3_;
  auVar21._5_8_ = 0;
  auVar21._0_5_ = auVar11._8_5_;
  auVar12[4] = (char)((uint)uVar7 >> 8);
  auVar12._0_4_ = (int)uVar8;
  auVar12[5] = 0;
  auVar12._6_7_ = SUB137(auVar21 << 0x40,6);
  lVar28 = 0;
  do {
    *(uint *)(dst + lVar28 + 0x600) =
         ((uint)(uint3)(auVar10._10_3_ >> 0x10) + (uint)(uint3)(auVar9._10_3_ >> 0x10) +
          auVar12._4_4_ + (int)CONCAT72(SUB137(auVar22 << 0x40,6),(ushort)(byte)(uVar25 >> 8)) +
          auVar11._8_4_ + (int)uVar20 + (int)uVar8 + (uVar25 & 0xff) + 4 >> 3 & 0xff) * 0x1010101;
    lVar28 = lVar28 + 0x20;
  } while (lVar28 != 0x80);
  puVar26 = dst + 0x604;
  bVar31 = top[-1];
  lVar28 = 0;
  do {
    bVar38 = top[-2 - lVar28];
    lVar30 = 0;
    do {
      puVar26[lVar30] = clip1[(ulong)top[lVar30] + (ulong)bVar38 + (0xff - (ulong)bVar31)];
      lVar30 = lVar30 + 1;
    } while (lVar30 != 4);
    puVar26 = puVar26 + 0x20;
    lVar28 = lVar28 + 1;
  } while (lVar28 != 4);
  uVar7 = *(undefined4 *)top;
  bVar38 = (byte)((uint)uVar7 >> 0x18);
  uVar17 = CONCAT25((short)(((uint7)bVar38 << 0x30) >> 0x28),
                    CONCAT14((char)((uint)uVar7 >> 0x10),uVar7));
  uVar24 = (uint7)CONCAT41((int)(CONCAT34((int3)((uint7)uVar17 >> 0x20),uVar7) >> 0x18),
                           (char)((uint)uVar7 >> 8)) & 0xffffff00ff;
  bVar31 = (byte)uVar7;
  sVar35 = (short)uVar24;
  sVar39 = (short)((uint7)uVar17 >> 0x20);
  auVar13[0xe] = bVar38;
  auVar13._0_14_ = ZEXT414(0);
  auVar15._10_2_ = sVar39;
  auVar15._0_10_ = (unkuint10)0;
  auVar15._12_3_ = auVar13._12_3_;
  auVar18._10_5_ = auVar15._10_5_;
  auVar18._0_10_ = (unkuint10)0;
  auVar23._2_7_ = auVar18._8_7_;
  auVar23._0_2_ = sVar35;
  auVar23._9_6_ = 0;
  auVar44._0_2_ = CONCAT11(0,top[-1]);
  auVar34 = ZEXT516(CONCAT14(bVar38,SUB154(auVar23 << 0x30,4))) << 0x40;
  auVar14._12_2_ = sVar39 + 2;
  auVar14._0_12_ = auVar34._0_12_;
  auVar14[0xe] = bVar38;
  auVar16._10_2_ = sVar39;
  auVar16._0_10_ = auVar34._0_10_;
  auVar16._12_3_ = auVar14._12_3_;
  auVar19._10_5_ = auVar16._10_5_;
  auVar19._8_2_ = sVar35 + 2;
  auVar19._6_2_ = sVar35;
  auVar19._0_6_ = (uint6)bVar31 << 0x20;
  auVar44[2] = bVar31;
  auVar44[3] = 0;
  auVar44._4_11_ = auVar19._4_11_;
  auVar44[0xf] = 0;
  auVar34 = pshufhw(ZEXT716(CONCAT52((int5)uVar24,(ushort)bVar31)),auVar44,0xf8);
  uVar8 = auVar34._8_8_ & 0xffffffffffff;
  uVar32 = (ushort)((short)uVar8 + (ushort)bVar31 * 2 + auVar44._0_2_) >> 2;
  uVar36 = (ushort)((short)(uVar8 >> 0x10) + sVar35 * 2 + (ushort)bVar31) >> 2;
  uVar40 = (ushort)((short)(uVar8 >> 0x20) + sVar39 * 2 + sVar35 + 2) >> 2;
  uVar42 = (ushort)((ushort)top[4] + (ushort)bVar38 * 2 + sVar39 + 2) >> 2;
  uVar33 = uVar32 & 0xff;
  uVar37 = uVar36 & 0xff;
  uVar41 = uVar40 & 0xff;
  uVar43 = uVar42 & 0xff;
  lVar28 = 0;
  do {
    *(uint *)(dst + lVar28 + 0x608) =
         CONCAT13((uVar43 != 0) * (uVar43 < 0x100) * (char)uVar42 - (0xff < uVar43),
                  CONCAT12((uVar41 != 0) * (uVar41 < 0x100) * (char)uVar40 - (0xff < uVar41),
                           CONCAT11((uVar37 != 0) * (uVar37 < 0x100) * (char)uVar36 -
                                    (0xff < uVar37),
                                    (uVar33 != 0) * (uVar33 < 0x100) * (char)uVar32 -
                                    (0xff < uVar33))));
    lVar28 = lVar28 + 0x20;
  } while (lVar28 != 0x80);
  bVar31 = top[-2];
  uVar29 = (uint)top[-3];
  uVar25 = (uint)top[-4];
  bVar38 = top[-5];
  *(uint *)(dst + 0x60c) = (uVar29 + (uint)top[-1] + (uint)bVar31 * 2 + 2 >> 2 & 0xff) * 0x1010101;
  *(uint *)(dst + 0x62c) = ((uint)bVar31 + uVar29 * 2 + uVar25 + 2 >> 2 & 0xff) * 0x1010101;
  *(uint *)(dst + 0x64c) = (uVar29 + uVar25 * 2 + 2 + (uint)bVar38 >> 2 & 0xff) * 0x1010101;
  *(uint *)(dst + 0x66c) = (uVar25 + bVar38 + 2 + (uint)bVar38 * 2 >> 2 & 0xff) * 0x1010101;
  bVar31 = top[-1];
  bVar38 = top[-2];
  bVar1 = top[-3];
  bVar2 = top[-4];
  bVar3 = *top;
  bVar4 = top[1];
  bVar5 = top[2];
  bVar6 = top[3];
  dst[0x670] = (uint8_t)((uint)top[-5] + (uint)bVar1 + (uint)bVar2 * 2 + 2 >> 2);
  uVar27 = (uint8_t)((uint)bVar38 + (uint)bVar1 * 2 + 2 + (uint)bVar2 >> 2);
  dst[0x671] = uVar27;
  dst[0x650] = uVar27;
  uVar27 = (uint8_t)((uint)bVar31 + (uint)bVar38 * 2 + 2 + (uint)bVar1 >> 2);
  dst[0x672] = uVar27;
  dst[0x651] = uVar27;
  dst[0x630] = uVar27;
  uVar27 = (uint8_t)((uint)bVar38 + (uint)bVar31 * 2 + 2 + (uint)bVar3 >> 2);
  dst[0x673] = uVar27;
  dst[0x652] = uVar27;
  dst[0x631] = uVar27;
  dst[0x610] = uVar27;
  uVar27 = (uint8_t)((uint)bVar31 + (uint)bVar4 + 2 + (uint)bVar3 * 2 >> 2);
  dst[0x653] = uVar27;
  dst[0x632] = uVar27;
  dst[0x611] = uVar27;
  uVar27 = (uint8_t)((uint)bVar3 + (uint)bVar5 + (uint)bVar4 * 2 + 2 >> 2);
  dst[0x633] = uVar27;
  dst[0x612] = uVar27;
  dst[0x613] = (uint8_t)((uint)bVar6 + (uint)bVar4 + (uint)bVar5 * 2 + 2 >> 2);
  bVar31 = top[-1];
  bVar38 = top[-2];
  bVar1 = top[-3];
  bVar2 = top[-4];
  bVar3 = *top;
  uVar29 = (uint)bVar3;
  bVar4 = top[1];
  uVar25 = (uint)bVar4;
  bVar5 = top[2];
  bVar6 = top[3];
  uVar27 = (uint8_t)((uint)bVar3 + (uint)bVar31 + 1 >> 1);
  dst[0x655] = uVar27;
  dst[0x614] = uVar27;
  uVar27 = (uint8_t)((uint)bVar3 + (uint)bVar4 + 1 >> 1);
  dst[0x656] = uVar27;
  dst[0x615] = uVar27;
  uVar27 = (uint8_t)((uint)bVar5 + (uint)bVar4 + 1 >> 1);
  dst[0x657] = uVar27;
  dst[0x616] = uVar27;
  dst[0x617] = (uint8_t)((uint)bVar5 + (uint)bVar6 + 1 >> 1);
  dst[0x674] = (uint8_t)((uint)bVar2 + (uint)bVar38 + 2 + (uint)bVar1 * 2 >> 2);
  dst[0x654] = (uint8_t)((uint)bVar1 + (uint)bVar31 + 2 + (uint)bVar38 * 2 >> 2);
  uVar27 = (uint8_t)((uint)bVar38 + (uint)bVar31 * 2 + 2 + uVar29 >> 2);
  dst[0x675] = uVar27;
  dst[0x634] = uVar27;
  uVar27 = (uint8_t)((uint)bVar31 + uVar29 * 2 + 2 + uVar25 >> 2);
  dst[0x676] = uVar27;
  dst[0x635] = uVar27;
  uVar27 = (uint8_t)(uVar29 + uVar25 * 2 + (uint)bVar5 + 2 >> 2);
  dst[0x677] = uVar27;
  dst[0x636] = uVar27;
  dst[0x637] = (uint8_t)(uVar25 + (uint)bVar5 * 2 + (uint)bVar6 + 2 >> 2);
  bVar31 = top[1];
  bVar38 = top[2];
  bVar1 = top[3];
  bVar2 = top[4];
  bVar3 = top[5];
  bVar4 = top[6];
  bVar5 = top[7];
  dst[0x618] = (uint8_t)((uint)*top + (uint)bVar31 * 2 + (uint)bVar38 + 2 >> 2);
  uVar27 = (uint8_t)((uint)bVar31 + (uint)bVar38 * 2 + (uint)bVar1 + 2 >> 2);
  dst[0x638] = uVar27;
  dst[0x619] = uVar27;
  uVar27 = (uint8_t)((uint)bVar38 + (uint)bVar1 * 2 + 2 + (uint)bVar2 >> 2);
  dst[0x658] = uVar27;
  dst[0x639] = uVar27;
  dst[0x61a] = uVar27;
  uVar27 = (uint8_t)((uint)bVar1 + (uint)bVar2 * 2 + 2 + (uint)bVar3 >> 2);
  dst[0x678] = uVar27;
  dst[0x659] = uVar27;
  dst[0x63a] = uVar27;
  dst[0x61b] = uVar27;
  uVar27 = (uint8_t)((uint)bVar2 + (uint)bVar4 + 2 + (uint)bVar3 * 2 >> 2);
  dst[0x679] = uVar27;
  dst[0x65a] = uVar27;
  dst[0x63b] = uVar27;
  uVar27 = (uint8_t)((uint)bVar3 + (uint)bVar5 + (uint)bVar4 * 2 + 2 >> 2);
  dst[0x67a] = uVar27;
  dst[0x65b] = uVar27;
  dst[0x67b] = (uint8_t)((uint)bVar4 + (uint)bVar5 + 2 + (uint)bVar5 * 2 >> 2);
  bVar31 = *top;
  bVar38 = top[1];
  bVar1 = top[2];
  bVar2 = top[3];
  bVar3 = top[4];
  bVar4 = top[5];
  bVar5 = top[6];
  bVar6 = top[7];
  dst[0x61c] = (uint8_t)((uint)bVar38 + (uint)bVar31 + 1 >> 1);
  uVar27 = (uint8_t)((uint)bVar38 + (uint)bVar1 + 1 >> 1);
  dst[0x65c] = uVar27;
  dst[0x61d] = uVar27;
  uVar27 = (uint8_t)((uint)bVar2 + (uint)bVar1 + 1 >> 1);
  dst[0x65d] = uVar27;
  dst[0x61e] = uVar27;
  uVar27 = (uint8_t)((uint)bVar2 + (uint)bVar3 + 1 >> 1);
  dst[0x65e] = uVar27;
  dst[0x61f] = uVar27;
  dst[0x63c] = (uint8_t)((uint)bVar31 + (uint)bVar38 * 2 + (uint)bVar1 + 2 >> 2);
  uVar27 = (uint8_t)((uint)bVar38 + (uint)bVar1 * 2 + (uint)bVar2 + 2 >> 2);
  dst[0x67c] = uVar27;
  dst[0x63d] = uVar27;
  uVar27 = (uint8_t)((uint)bVar1 + (uint)bVar2 * 2 + 2 + (uint)bVar3 >> 2);
  dst[0x67d] = uVar27;
  dst[0x63e] = uVar27;
  uVar27 = (uint8_t)((uint)bVar2 + (uint)bVar3 * 2 + 2 + (uint)bVar4 >> 2);
  dst[0x67e] = uVar27;
  dst[0x63f] = uVar27;
  dst[0x65f] = (uint8_t)((uint)bVar3 + (uint)bVar4 * 2 + (uint)bVar5 + 2 >> 2);
  dst[0x67f] = (uint8_t)((uint)bVar6 + (uint)bVar4 + (uint)bVar5 * 2 + 2 >> 2);
  bVar31 = top[-1];
  bVar38 = top[-2];
  bVar1 = top[-3];
  bVar2 = top[-4];
  bVar3 = top[-5];
  bVar4 = *top;
  bVar5 = top[1];
  bVar6 = top[2];
  uVar27 = (uint8_t)((uint)bVar38 + (uint)bVar31 + 1 >> 1);
  dst[0x6a2] = uVar27;
  dst[0x680] = uVar27;
  uVar27 = (uint8_t)((uint)bVar38 + (uint)bVar1 + 1 >> 1);
  dst[0x6c2] = uVar27;
  dst[0x6a0] = uVar27;
  uVar27 = (uint8_t)((uint)bVar2 + (uint)bVar1 + 1 >> 1);
  dst[0x6e2] = uVar27;
  dst[0x6c0] = uVar27;
  dst[0x6e0] = (uint8_t)((uint)bVar2 + (uint)bVar3 + 1 >> 1);
  dst[0x683] = (uint8_t)((uint)bVar6 + (uint)bVar4 + (uint)bVar5 * 2 + 2 >> 2);
  dst[0x682] = (uint8_t)((uint)bVar31 + (uint)bVar4 * 2 + 2 + (uint)bVar5 >> 2);
  uVar27 = (uint8_t)((uint)bVar38 + (uint)bVar31 * 2 + 2 + (uint)bVar4 >> 2);
  dst[0x6a3] = uVar27;
  dst[0x681] = uVar27;
  uVar27 = (uint8_t)((uint)bVar31 + (uint)bVar1 + 2 + (uint)bVar38 * 2 >> 2);
  dst[0x6c3] = uVar27;
  dst[0x6a1] = uVar27;
  uVar27 = (uint8_t)((uint)bVar38 + (uint)bVar2 + 2 + (uint)bVar1 * 2 >> 2);
  dst[0x6e3] = uVar27;
  dst[0x6c1] = uVar27;
  dst[0x6e1] = (uint8_t)((uint)bVar1 + (uint)bVar3 + (uint)bVar2 * 2 + 2 >> 2);
  bVar31 = top[-2];
  bVar38 = top[-3];
  bVar1 = top[-4];
  bVar2 = top[-5];
  dst[0x684] = (uint8_t)((uint)bVar38 + (uint)bVar31 + 1 >> 1);
  uVar27 = (uint8_t)((uint)bVar38 + (uint)bVar1 + 1 >> 1);
  dst[0x6a4] = uVar27;
  dst[0x686] = uVar27;
  uVar27 = (uint8_t)((uint)bVar1 + (uint)bVar2 + 1 >> 1);
  dst[0x6c4] = uVar27;
  dst[0x6a6] = uVar27;
  dst[0x685] = (uint8_t)((uint)bVar31 + (uint)bVar38 * 2 + (uint)bVar1 + 2 >> 2);
  uVar27 = (uint8_t)((uint)bVar38 + (uint)bVar2 + (uint)bVar1 * 2 + 2 >> 2);
  dst[0x6a5] = uVar27;
  dst[0x687] = uVar27;
  uVar27 = (uint8_t)((uint)bVar1 + (uint)bVar2 + 2 + (uint)bVar2 * 2 >> 2);
  dst[0x6c5] = uVar27;
  dst[0x6a7] = uVar27;
  auVar34 = pshuflw(ZEXT216(CONCAT11(bVar2,bVar2)),ZEXT216(CONCAT11(bVar2,bVar2)),0);
  *(int *)(dst + 0x6e4) = auVar34._0_4_;
  dst[0x6c6] = bVar2;
  dst[0x6c7] = bVar2;
  return;
}

Assistant:

static void Intra4Preds_C(uint8_t* dst, const uint8_t* top) {
  DC4(I4DC4 + dst, top);
  TM4(I4TM4 + dst, top);
  VE4(I4VE4 + dst, top);
  HE4(I4HE4 + dst, top);
  RD4(I4RD4 + dst, top);
  VR4(I4VR4 + dst, top);
  LD4(I4LD4 + dst, top);
  VL4(I4VL4 + dst, top);
  HD4(I4HD4 + dst, top);
  HU4(I4HU4 + dst, top);
}